

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

float glu::TextureTestUtil::computeProjectedTriLod
                (LodMode mode,Vec3 *u,Vec3 *v,Vec3 *projection,float wx,float wy,float width,
                float height)

{
  float fVar1;
  float dvdx_00;
  float dudy_00;
  float dvdy_00;
  float dvdy;
  float dudy;
  float dvdx;
  float dudx;
  float height_local;
  float width_local;
  float wy_local;
  float wx_local;
  Vec3 *projection_local;
  Vec3 *v_local;
  Vec3 *u_local;
  LodMode mode_local;
  
  fVar1 = triDerivateX(u,projection,wx,width,wy / height);
  dvdx_00 = triDerivateX(v,projection,wx,width,wy / height);
  dudy_00 = triDerivateY(u,projection,wy,height,wx / width);
  dvdy_00 = triDerivateY(v,projection,wy,height,wx / width);
  fVar1 = computeLodFromDerivates(mode,fVar1,dvdx_00,dudy_00,dvdy_00);
  return fVar1;
}

Assistant:

static float computeProjectedTriLod (LodMode mode, const tcu::Vec3& u, const tcu::Vec3& v, const tcu::Vec3& projection, float wx, float wy, float width, float height)
{
	// Exact derivatives.
	float dudx	= triDerivateX(u, projection, wx, width, wy/height);
	float dvdx	= triDerivateX(v, projection, wx, width, wy/height);
	float dudy	= triDerivateY(u, projection, wy, height, wx/width);
	float dvdy	= triDerivateY(v, projection, wy, height, wx/width);

	return computeLodFromDerivates(mode, dudx, dvdx, dudy, dvdy);
}